

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O2

Vector3D * __thiscall CMU462::Face::centroid(Vector3D *__return_storage_ptr__,Face *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  p_Var1 = (this->_halfedge)._M_node;
  dVar5 = 0.0;
  dVar6 = 0.0;
  dVar4 = 0.0;
  dVar7 = 0.0;
  p_Var3 = p_Var1;
  do {
    p_Var2 = p_Var3[2]._M_prev;
    p_Var3 = p_Var3[2]._M_next;
    dVar4 = dVar4 + (double)p_Var2[2]._M_prev;
    dVar5 = dVar5 + (double)p_Var2[1]._M_prev;
    dVar6 = dVar6 + (double)p_Var2[2]._M_next;
    dVar7 = dVar7 + 1.0;
  } while (p_Var1 != p_Var3);
  dVar7 = 1.0 / dVar7;
  __return_storage_ptr__->x = dVar7 * dVar5;
  __return_storage_ptr__->y = dVar7 * dVar6;
  __return_storage_ptr__->z = dVar4 * dVar7;
  return __return_storage_ptr__;
}

Assistant:

Vector3D Face::centroid() const
  {
    Vector3D c( 0., 0., 0. );
    double d = 0.;

    // walk around the face
    HalfedgeIter h = _halfedge;
    do {
      c += h->vertex()->position;
      d += 1.;

      h = h->next();
    } while (h != _halfedge);  // done walking around the face

    return c / d;
  }